

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

ptr<Expression> __thiscall Parser::factor(Parser *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Alloc_hider _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  Parser *in_RSI;
  ptr<Expression> pVar5;
  undefined1 local_49;
  _Alloc_hider local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  shared_ptr<Division> local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  merge(this);
  bVar3 = match(in_RSI,Mult);
  if (bVar3) {
    consume(in_RSI);
    local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
    (local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_use_count = 1;
    (local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_weak_count = 1;
    (local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012f6e0;
    local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
    local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _vptr__Sp_counted_base = (_func_int **)&PTR_asStrings_0012f730;
    factor((Parser *)&stack0xffffffffffffffe0);
    local_48._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<BinaryOperator,std::allocator<BinaryOperator>,std::shared_ptr<Multiplication>&,std::shared_ptr<Expression>&,std::shared_ptr<Expression>&>
              (a_Stack_40,(BinaryOperator **)&local_48,(allocator<BinaryOperator> *)&local_49,
               (shared_ptr<Multiplication> *)&local_30,(shared_ptr<Expression> *)this,
               (shared_ptr<Expression> *)&stack0xffffffffffffffe0);
    _Var4._M_pi = extraout_RDX;
  }
  else {
    bVar3 = match(in_RSI,Div);
    if (bVar3) {
      consume(in_RSI);
      local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
      (local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = 1;
      (local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = 1;
      (local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012f860;
      local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1)
      ;
      local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
      _vptr__Sp_counted_base = (_func_int **)&PTR_asStrings_0012f8b0;
      factor((Parser *)&stack0xffffffffffffffe0);
      local_48._M_p = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<BinaryOperator,std::allocator<BinaryOperator>,std::shared_ptr<Division>&,std::shared_ptr<Expression>&,std::shared_ptr<Expression>&>
                (a_Stack_40,(BinaryOperator **)&local_48,(allocator<BinaryOperator> *)&local_49,
                 &local_30,(shared_ptr<Expression> *)this,
                 (shared_ptr<Expression> *)&stack0xffffffffffffffe0);
      _Var4._M_pi = extraout_RDX_00;
    }
    else {
      bVar3 = match(in_RSI,Exp);
      if (bVar3) {
        consume(in_RSI);
        local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
        (local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = 1;
        (local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_weak_count = 1;
        (local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012f920;
        local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             1);
        local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
        _vptr__Sp_counted_base = (_func_int **)&PTR_asStrings_0012f970;
        factor((Parser *)&stack0xffffffffffffffe0);
        local_48._M_p = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<BinaryOperator,std::allocator<BinaryOperator>,std::shared_ptr<Exponentiation>&,std::shared_ptr<Expression>&,std::shared_ptr<Expression>&>
                  (a_Stack_40,(BinaryOperator **)&local_48,(allocator<BinaryOperator> *)&local_49,
                   (shared_ptr<Exponentiation> *)&local_30,(shared_ptr<Expression> *)this,
                   (shared_ptr<Expression> *)&stack0xffffffffffffffe0);
        _Var4._M_pi = extraout_RDX_01;
      }
      else {
        bVar3 = match(in_RSI,Mod);
        _Var4._M_pi = extraout_RDX_02;
        if (!bVar3) goto LAB_0010f866;
        consume(in_RSI);
        local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
        (local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = 1;
        (local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_weak_count = 1;
        (local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012f9e0;
        local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             1);
        local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
        _vptr__Sp_counted_base = (_func_int **)&PTR_asStrings_0012fa30;
        factor((Parser *)&stack0xffffffffffffffe0);
        local_48._M_p = (pointer)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<BinaryOperator,std::allocator<BinaryOperator>,std::shared_ptr<Modulo>&,std::shared_ptr<Expression>&,std::shared_ptr<Expression>&>
                  (a_Stack_40,(BinaryOperator **)&local_48,(allocator<BinaryOperator> *)&local_49,
                   (shared_ptr<Modulo> *)&local_30,(shared_ptr<Expression> *)this,
                   (shared_ptr<Expression> *)&stack0xffffffffffffffe0);
        _Var4._M_pi = extraout_RDX_03;
      }
    }
  }
  _Var2._M_pi = a_Stack_40[0]._M_pi;
  _Var1._M_p = local_48._M_p;
  local_48._M_p = (pointer)0x0;
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->filepath)._M_string_length;
  (this->filepath)._M_dataplus._M_p = _Var1._M_p;
  (this->filepath)._M_string_length = (size_type)_Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var4._M_pi = extraout_RDX_04;
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
      _Var4._M_pi = extraout_RDX_05;
    }
  }
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
    _Var4._M_pi = extraout_RDX_06;
  }
  if (local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<Division,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var4._M_pi = extraout_RDX_07;
  }
LAB_0010f866:
  pVar5.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  pVar5.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar5.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::factor() {
    ptr<Expression> expr = merge();

    if(match(TokenType::Mult)) {
        consume();
        expr = make<BinaryOperator>(make<Multiplication>(), expr, factor());
    } else if(match(TokenType::Div)) {
        consume();
        expr = make<BinaryOperator>(make<Division>(), expr, factor());
    } else if(match(TokenType::Exp)) {
        consume();
        expr = make<BinaryOperator>(make<Exponentiation>(), expr, factor());
    } else if(match(TokenType::Mod)) {
        consume();
        expr = make<BinaryOperator>(make<Modulo>(), expr, factor());
    }

    return expr;
}